

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

bool __thiscall anon_unknown.dwarf_3ea2e::CLIncludeParser::ProcessLine(CLIncludeParser *this)

{
  ofstream *poVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  char *__s;
  string_view str;
  string_view str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string path;
  path local_40;
  
  str._M_str = (this->super_LineParser).Line._M_dataplus._M_p;
  str._M_len = (this->super_LineParser).Line._M_string_length;
  bVar2 = cmHasPrefix(str,this->IncludePrefix);
  if (bVar2) {
    __s = (this->super_LineParser).Line._M_dataplus._M_p + (this->IncludePrefix)._M_len;
    sVar3 = strlen(__s);
    str_00._M_str = __s;
    str_00._M_len = sVar3;
    cmTrimWhitespace_abi_cxx11_(&path,str_00);
    cmSystemTools::ConvertToLongPath(&path);
    poVar1 = this->DepFile;
    std::__cxx11::string::string((string *)&local_a0,(string *)&path);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_40,&local_a0,generic_format);
    std::filesystem::__cxx11::path::generic_string(&local_80,&local_40);
    poVar4 = std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)&local_80);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_80);
    std::filesystem::__cxx11::path::~path(&local_40);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&path);
  }
  else {
    poVar4 = std::operator<<(this->Output,(string *)&(this->super_LineParser).Line);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (cmHasPrefix(this->Line, this->IncludePrefix)) {
      auto path =
        cmTrimWhitespace(this->Line.c_str() + this->IncludePrefix.size());
      cmSystemTools::ConvertToLongPath(path);
      this->DepFile << cmCMakePath(path).GenericString() << std::endl;
    } else {
      this->Output << this->Line << std::endl << std::flush;
    }

    return true;
  }